

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElementType::IfcDistributionControlElementType
          (IfcDistributionControlElementType *this,void **vtt)

{
  void *pvVar1;
  
  IfcDistributionElementType::IfcDistributionElementType
            (&this->super_IfcDistributionElementType,vtt + 1);
  pvVar1 = vtt[0x28];
  *(void **)&(this->super_IfcDistributionElementType).super_IfcElementType.field_0x190 = pvVar1;
  *(void **)(&(this->super_IfcDistributionElementType).super_IfcElementType.field_0x190 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x29];
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject = pvVar1;
  *(void **)(&(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
              super_IfcTypeObject.field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x2a];
  *(void **)&(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0x88 = vtt[0x2b];
  (this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
  super_IfcTypeObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x2c];
  *(void **)&(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0xf0 = vtt[0x2d];
  *(void **)&(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
             field_0x148 = vtt[0x2e];
  *(void **)&(this->super_IfcDistributionElementType).super_IfcElementType.field_0x180 = vtt[0x2f];
  *(void **)&(this->super_IfcDistributionElementType).super_IfcElementType.field_0x190 = vtt[0x30];
  return;
}

Assistant:

IfcDistributionControlElementType() : Object("IfcDistributionControlElementType") {}